

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBalance.c
# Opt level: O1

void Abc_NodeBalancePermute(Abc_Ntk_t *pNtkNew,Vec_Ptr_t *vSuper,int LeftBound)

{
  int iVar1;
  Abc_Obj_t *p0;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *p1;
  bool bVar3;
  Abc_Obj_t *pAVar4;
  uint uVar5;
  uint uVar6;
  
  uVar6 = vSuper->nSize;
  uVar5 = uVar6 - 2;
  if ((int)uVar5 < LeftBound) {
    __assert_fail("LeftBound <= RightBound",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcBalance.c"
                  ,0xc6,"void Abc_NodeBalancePermute(Abc_Ntk_t *, Vec_Ptr_t *, int)");
  }
  if (uVar5 != LeftBound) {
    if (((int)uVar6 < 1) || ((ulong)uVar6 == 1)) {
LAB_0023f95b:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    if (LeftBound <= (int)uVar5) {
      p0 = (Abc_Obj_t *)vSuper->pArray[(ulong)uVar6 - 1];
      pAVar2 = (Abc_Obj_t *)vSuper->pArray[uVar5];
      uVar6 = uVar5;
      do {
        if (((int)uVar6 < 0) || (vSuper->nSize <= (int)uVar6)) goto LAB_0023f95b;
        p1 = (Abc_Obj_t *)vSuper->pArray[uVar6];
        pAVar4 = Abc_AigAndLookup((Abc_Aig_t *)pNtkNew->pManFunc,p0,p1);
        if (pAVar4 != (Abc_Obj_t *)0x0) {
          if (p1 == pAVar2) {
            return;
          }
          iVar1 = vSuper->nSize;
          if (((int)uVar6 < iVar1) && (vSuper->pArray[uVar6] = pAVar2, (int)uVar5 < iVar1)) {
            vSuper->pArray[uVar5] = p1;
            return;
          }
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
        }
        bVar3 = LeftBound < (int)uVar6;
        uVar6 = uVar6 - 1;
      } while (bVar3);
    }
  }
  return;
}

Assistant:

void Abc_NodeBalancePermute( Abc_Ntk_t * pNtkNew, Vec_Ptr_t * vSuper, int LeftBound )
{
    Abc_Obj_t * pNode1, * pNode2, * pNode3;
    int RightBound, i;
    // get the right bound
    RightBound = Vec_PtrSize(vSuper) - 2;
    assert( LeftBound <= RightBound );
    if ( LeftBound == RightBound )
        return;
    // get the two last nodes
    pNode1 = (Abc_Obj_t *)Vec_PtrEntry( vSuper, RightBound + 1 );
    pNode2 = (Abc_Obj_t *)Vec_PtrEntry( vSuper, RightBound     );
    // find the first node that can be shared
    for ( i = RightBound; i >= LeftBound; i-- )
    {
        pNode3 = (Abc_Obj_t *)Vec_PtrEntry( vSuper, i );
        if ( Abc_AigAndLookup( (Abc_Aig_t *)pNtkNew->pManFunc, pNode1, pNode3 ) )
        {
            if ( pNode3 == pNode2 )
                return;
            Vec_PtrWriteEntry( vSuper, i,          pNode2 );
            Vec_PtrWriteEntry( vSuper, RightBound, pNode3 );
            return;
        }
    }
/*
    // we did not find the node to share, randomize choice
    {
        int Choice = rand() % (RightBound - LeftBound + 1);
        pNode3 = Vec_PtrEntry( vSuper, LeftBound + Choice );
        if ( pNode3 == pNode2 )
            return;
        Vec_PtrWriteEntry( vSuper, LeftBound + Choice, pNode2 );
        Vec_PtrWriteEntry( vSuper, RightBound,         pNode3 );
    }
*/
}